

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecClass.c
# Opt level: O3

void Cec_ManSimCompareEqualScore(uint *p0,uint *p1,int nWords,int *pScores)

{
  ulong uVar1;
  long lVar2;
  
  if (((*p1 ^ *p0) & 1) == 0) {
    if (0 < nWords) {
      uVar1 = 0;
      do {
        if (p0[uVar1] != p1[uVar1]) {
          lVar2 = 0;
          do {
            if (((p1[uVar1] ^ p0[uVar1]) >> ((uint)lVar2 & 0x1f) & 1) != 0) {
              pScores[(ulong)((uint)uVar1 & 0x7ffffff) * 0x20 + lVar2] =
                   pScores[(ulong)((uint)uVar1 & 0x7ffffff) * 0x20 + lVar2] + 1;
            }
            lVar2 = lVar2 + 1;
          } while (lVar2 != 0x20);
        }
        uVar1 = uVar1 + 1;
      } while (uVar1 != (uint)nWords);
    }
  }
  else if (0 < nWords) {
    uVar1 = 0;
    do {
      if ((p1[uVar1] ^ p0[uVar1]) != 0xffffffff) {
        lVar2 = 0;
        do {
          if (((p1[uVar1] ^ p0[uVar1]) >> ((uint)lVar2 & 0x1f) & 1) == 0) {
            pScores[(ulong)((uint)uVar1 & 0x7ffffff) * 0x20 + lVar2] =
                 pScores[(ulong)((uint)uVar1 & 0x7ffffff) * 0x20 + lVar2] + 1;
          }
          lVar2 = lVar2 + 1;
        } while (lVar2 != 0x20);
      }
      uVar1 = uVar1 + 1;
    } while (uVar1 != (uint)nWords);
  }
  return;
}

Assistant:

void Cec_ManSimCompareEqualScore( unsigned * p0, unsigned * p1, int nWords, int * pScores )
{
    int w, b;
    if ( (p0[0] & 1) == (p1[0] & 1) )
    {
        for ( w = 0; w < nWords; w++ )
            if ( p0[w] != p1[w] )
                for ( b = 0; b < 32; b++ )
                    if ( ((p0[w] ^ p1[w]) >> b ) & 1 )
                        pScores[32*w + b]++;
    }
    else
    {
        for ( w = 0; w < nWords; w++ )
            if ( p0[w] != ~p1[w] )
                for ( b = 0; b < 32; b++ )
                    if ( ((p0[w] ^ ~p1[w]) >> b ) & 1 )
                        pScores[32*w + b]++;
    }
}